

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phoenix_evsa.cpp
# Opt level: O1

void __thiscall phoenix_evsa_t::_read(phoenix_evsa_t *this)

{
  evsa_body_t *peVar1;
  uint8_t uVar2;
  uint16_t uVar3;
  uint32_t uVar4;
  kstream *this_00;
  evsa_body_t *this_01;
  string local_38;
  
  uVar2 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
  this->m_type = uVar2;
  uVar2 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
  this->m_checksum = uVar2;
  uVar3 = kaitai::kstream::read_u2le((this->super_kstruct).m__io);
  this->m_len_evsa_store_header = uVar3;
  uVar4 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
  this->m_signature = uVar4;
  uVar4 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
  this->m_attributes = uVar4;
  uVar4 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
  this->m_len_evsa_store = uVar4;
  uVar4 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
  this->m_reserved = uVar4;
  kaitai::kstream::read_bytes_abi_cxx11_
            (&local_38,(this->super_kstruct).m__io,
             (ulong)(this->m_len_evsa_store - (uint)this->m_len_evsa_store_header));
  std::__cxx11::string::operator=((string *)&this->m__raw_body,(string *)&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  this_00 = (kstream *)operator_new(0x198);
  kaitai::kstream::kstream(this_00,&this->m__raw_body);
  std::__uniq_ptr_impl<kaitai::kstream,_std::default_delete<kaitai::kstream>_>::reset
            ((__uniq_ptr_impl<kaitai::kstream,_std::default_delete<kaitai::kstream>_> *)
             &this->m__io__raw_body,this_00);
  this_01 = (evsa_body_t *)operator_new(0x30);
  evsa_body_t::evsa_body_t
            (this_01,(this->m__io__raw_body)._M_t.
                     super___uniq_ptr_impl<kaitai::kstream,_std::default_delete<kaitai::kstream>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_kaitai::kstream_*,_std::default_delete<kaitai::kstream>_>
                     .super__Head_base<0UL,_kaitai::kstream_*,_false>._M_head_impl,this,
             this->m__root);
  peVar1 = (this->m_body)._M_t.
           super___uniq_ptr_impl<phoenix_evsa_t::evsa_body_t,_std::default_delete<phoenix_evsa_t::evsa_body_t>_>
           ._M_t.
           super__Tuple_impl<0UL,_phoenix_evsa_t::evsa_body_t_*,_std::default_delete<phoenix_evsa_t::evsa_body_t>_>
           .super__Head_base<0UL,_phoenix_evsa_t::evsa_body_t_*,_false>._M_head_impl;
  (this->m_body)._M_t.
  super___uniq_ptr_impl<phoenix_evsa_t::evsa_body_t,_std::default_delete<phoenix_evsa_t::evsa_body_t>_>
  ._M_t.
  super__Tuple_impl<0UL,_phoenix_evsa_t::evsa_body_t_*,_std::default_delete<phoenix_evsa_t::evsa_body_t>_>
  .super__Head_base<0UL,_phoenix_evsa_t::evsa_body_t_*,_false>._M_head_impl = this_01;
  if (peVar1 != (evsa_body_t *)0x0) {
    (**(code **)((long)(peVar1->super_kstruct)._vptr_kstruct + 8))();
  }
  return;
}

Assistant:

void phoenix_evsa_t::_read() {
    m_type = m__io->read_u1();
    m_checksum = m__io->read_u1();
    m_len_evsa_store_header = m__io->read_u2le();
    m_signature = m__io->read_u4le();
    m_attributes = m__io->read_u4le();
    m_len_evsa_store = m__io->read_u4le();
    m_reserved = m__io->read_u4le();
    m__raw_body = m__io->read_bytes((len_evsa_store() - len_evsa_store_header()));
    m__io__raw_body = std::unique_ptr<kaitai::kstream>(new kaitai::kstream(m__raw_body));
    m_body = std::unique_ptr<evsa_body_t>(new evsa_body_t(m__io__raw_body.get(), this, m__root));
}